

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

void Curl_bufq_free(bufq *q)

{
  buf_chunk *pbVar1;
  
  pbVar1 = q->head;
  while (pbVar1 != (buf_chunk *)0x0) {
    q->head = pbVar1->next;
    (*Curl_cfree)(pbVar1);
    pbVar1 = q->head;
  }
  pbVar1 = q->spare;
  while (pbVar1 != (buf_chunk *)0x0) {
    q->spare = pbVar1->next;
    (*Curl_cfree)(pbVar1);
    pbVar1 = q->spare;
  }
  q->tail = (buf_chunk *)0x0;
  q->chunk_count = 0;
  return;
}

Assistant:

void Curl_bufq_free(struct bufq *q)
{
  chunk_list_free(&q->head);
  chunk_list_free(&q->spare);
  q->tail = NULL;
  q->chunk_count = 0;
}